

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::prepareProgram
          (OperatorPerformanceCase *this,int progNdx)

{
  pointer puVar1;
  pointer puVar2;
  OperatorPerformanceCase *pOVar3;
  pointer pfVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong __new_size;
  long lVar9;
  int attribNdx;
  ulong uVar10;
  int iVar11;
  Vec4 *pVVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  Vec4 local_158;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  int local_12c;
  OperatorPerformanceCase *local_128;
  long local_120;
  ShaderProgram *local_118;
  pointer local_110;
  float local_108;
  int local_104;
  int local_100;
  int local_fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_f8;
  ulong local_f0;
  ulong local_e8;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  vector<float,_std::allocator<float>_> vertices;
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar5);
  local_118 = (this->m_programs).
              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
              ._M_impl.super__Vector_impl_data._M_start[progNdx].m_ptr;
  std::
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::vector(&attributes,
           &(this->m_programData).
            super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_start[progNdx].attributes);
  local_158.m_data[0] = -1.0;
  local_158.m_data[1] = -1.0;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = -1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = -1.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  local_68.m_data[0] = 1.0;
  local_68.m_data[1] = 1.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 1.0;
  AttribSpec::AttribSpec
            ((AttribSpec *)&vertices,"a_position",&local_158,&local_48,&local_58,&local_68);
  std::
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::push_back(&attributes,(value_type *)&vertices);
  std::__cxx11::string::~string((string *)&vertices);
  puVar1 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_128 = this;
  if (puVar1 != puVar2) {
    (**(code **)(lVar13 + 0x438))((ulong)((long)puVar2 - (long)puVar1) >> 2);
  }
  pOVar3 = local_128;
  local_f8 = &local_128->m_attribBuffers;
  local_110 = attributes.
              super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
  __new_size = ((long)attributes.
                      super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)attributes.
                     super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x60;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (local_f8,__new_size,(value_type_conflict2 *)&vertices);
  (**(code **)(lVar13 + 0x6c8))
            ((ulong)((long)(pOVar3->m_attribBuffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pOVar3->m_attribBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"glGenBuffers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pShaderOperatorTests.cpp"
                  ,0x286);
  uVar10 = 0;
  local_f0 = __new_size & 0xffffffff;
  if ((int)__new_size < 1) {
    local_f0 = uVar10;
  }
  pVVar12 = &local_110->p11;
  local_120 = lVar13;
  for (; lVar13 = local_120, uVar10 != local_f0; uVar10 = uVar10 + 1) {
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar5 = local_128->m_gridSizeX;
    iVar8 = local_128->m_gridSizeY;
    std::vector<float,_std::allocator<float>_>::resize(&vertices,(long)(iVar5 * iVar8 * 0x18));
    local_130 = (float)iVar5;
    local_108 = (float)iVar8;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    iVar11 = 0;
    iVar7 = 0;
    local_104 = iVar8;
    local_fc = iVar5;
    local_e8 = uVar10;
    while (pfVar4 = vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start, uVar10 = local_e8, iVar7 != local_104) {
      local_100 = iVar7 + 1;
      local_13c = (float)iVar7 / local_108;
      local_140 = (float)local_100 / local_108;
      iVar8 = 0;
      while (iVar7 = local_100, iVar8 != iVar5) {
        local_134 = (float)iVar8 / local_130;
        local_12c = iVar8 + 1;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          local_158.m_data[1] = pVVar12[-2].m_data[lVar13];
          local_158.m_data[0] = pVVar12[-3].m_data[lVar13];
          local_158.m_data[3] = pVVar12->m_data[lVar13];
          local_158.m_data[2] = pVVar12[-1].m_data[lVar13];
          fVar15 = triQuadInterpolate(local_134,local_13c,&local_158);
          pfVar4[iVar11 + (int)lVar13] = fVar15;
        }
        local_138 = (float)local_12c / local_130;
        iVar11 = iVar11 + 4;
        lVar14 = -4;
        for (lVar13 = -0x10; lVar9 = lVar14, lVar13 != 0; lVar13 = lVar13 + 4) {
          local_158.m_data[1] = *(float *)((long)pVVar12[-1].m_data + lVar13);
          local_158.m_data[0] = *(float *)((long)pVVar12[-2].m_data + lVar13);
          local_158.m_data[3] = *(float *)((long)(pVVar12 + 1) + lVar13);
          local_158.m_data[2] = *(float *)((long)pVVar12->m_data + lVar13);
          fVar15 = triQuadInterpolate(local_138,local_13c,&local_158);
          lVar9 = (long)iVar11;
          iVar11 = iVar11 + 1;
          pfVar4[lVar9] = fVar15;
        }
        for (; lVar13 = lVar14, lVar9 != 0; lVar9 = lVar9 + 1) {
          local_158.m_data[1] = pVVar12[-1].m_data[lVar9];
          local_158.m_data[0] = pVVar12[-2].m_data[lVar9];
          local_158.m_data[3] = *(float *)((long)(pVVar12 + 1) + lVar9 * 4);
          local_158.m_data[2] = pVVar12->m_data[lVar9];
          fVar15 = triQuadInterpolate(local_134,local_140,&local_158);
          lVar13 = (long)iVar11;
          iVar11 = iVar11 + 1;
          pfVar4[lVar13] = fVar15;
        }
        for (; lVar9 = lVar14, lVar13 != 0; lVar13 = lVar13 + 1) {
          local_158.m_data[1] = pVVar12[-1].m_data[lVar13];
          local_158.m_data[0] = pVVar12[-2].m_data[lVar13];
          local_158.m_data[3] = *(float *)((long)(pVVar12 + 1) + lVar13 * 4);
          local_158.m_data[2] = pVVar12->m_data[lVar13];
          fVar15 = triQuadInterpolate(local_138,local_13c,&local_158);
          lVar9 = (long)iVar11;
          iVar11 = iVar11 + 1;
          pfVar4[lVar9] = fVar15;
        }
        for (; lVar9 != 0; lVar9 = lVar9 + 1) {
          local_158.m_data[1] = pVVar12[-1].m_data[lVar9];
          local_158.m_data[0] = pVVar12[-2].m_data[lVar9];
          local_158.m_data[3] = *(float *)((long)(pVVar12 + 1) + lVar9 * 4);
          local_158.m_data[2] = pVVar12->m_data[lVar9];
          fVar15 = triQuadInterpolate(local_138,local_140,&local_158);
          lVar13 = (long)iVar11;
          iVar11 = iVar11 + 1;
          pfVar4[lVar13] = fVar15;
        }
        for (; iVar8 = local_12c, iVar5 = local_fc, lVar14 != 0; lVar14 = lVar14 + 1) {
          local_158.m_data[1] = pVVar12[-1].m_data[lVar14];
          local_158.m_data[0] = pVVar12[-2].m_data[lVar14];
          local_158.m_data[3] = *(float *)((long)(pVVar12 + 1) + lVar14 * 4);
          local_158.m_data[2] = pVVar12->m_data[lVar14];
          fVar15 = triQuadInterpolate(local_134,local_140,&local_158);
          lVar13 = (long)iVar11;
          iVar11 = iVar11 + 1;
          pfVar4[lVar13] = fVar15;
        }
      }
    }
    (**(code **)(local_120 + 0x40))
              (0x8892,(local_f8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[local_e8]);
    (**(code **)(local_120 + 0x150))
              (0x8892,(long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
               vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    dVar6 = (**(code **)(local_120 + 0x800))();
    glu::checkError(dVar6,"Upload buffer data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pShaderOperatorTests.cpp"
                    ,0x28f);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&vertices.super__Vector_base<float,_std::allocator<float>_>);
    pVVar12 = pVVar12 + 6;
  }
  for (uVar10 = 0; local_f0 != uVar10; uVar10 = uVar10 + 1) {
    iVar5 = (**(code **)(lVar13 + 0x780))
                      ((local_118->m_program).m_program,(local_110->name)._M_dataplus._M_p);
    if (-1 < iVar5) {
      (**(code **)(lVar13 + 0x610))(iVar5);
      (**(code **)(lVar13 + 0x40))
                (0x8892,(local_f8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar10]);
      (**(code **)(lVar13 + 0x19f0))(iVar5,4,0x1406,0,0,0);
    }
    local_110 = local_110 + 1;
  }
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Setup vertex input state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pShaderOperatorTests.cpp"
                  ,0x29e);
  (**(code **)(lVar13 + 0x1680))((local_118->m_program).m_program);
  (*(local_128->super_TestCase).super_TestNode._vptr_TestNode[6])
            (local_128,(ulong)(local_118->m_program).m_program);
  (**(code **)(lVar13 + 0x1a00))(0,0,local_128->m_viewportWidth,local_128->m_viewportHeight);
  std::
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::~vector(&attributes);
  return;
}

Assistant:

void OperatorPerformanceCase::prepareProgram (int progNdx)
{
	DE_ASSERT(progNdx < (int)m_programs.size());
	DE_ASSERT(m_programData.size() == m_programs.size());

	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const ShaderProgram&	program		= *m_programs[progNdx];

	vector<AttribSpec>		attributes	= m_programData[progNdx].attributes;

	attributes.push_back(AttribSpec("a_position",
									Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
									Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
									Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
									Vec4( 1.0f,  1.0f, 0.0f, 1.0f)));

	DE_ASSERT(program.isOk());

	// Generate vertices.
	if (!m_attribBuffers.empty())
		gl.deleteBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	m_attribBuffers.resize(attributes.size(), 0);
	gl.genBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		std::vector<float> vertices;
		generateVertices(vertices, m_gridSizeX, m_gridSizeY, attributes[attribNdx]);

		gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertices.size()*sizeof(float)), &vertices[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Upload buffer data");
	}

	// Setup attribute bindings.
	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		int location = gl.getAttribLocation(program.getProgram(), attributes[attribNdx].name.c_str());

		if (location >= 0)
		{
			gl.enableVertexAttribArray(location);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		}
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Setup vertex input state");

	gl.useProgram(program.getProgram());
	setGeneralUniforms(program.getProgram());
	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);
}